

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.cc
# Opt level: O2

void __thiscall
Pl_TIFFPredictor::Pl_TIFFPredictor
          (Pl_TIFFPredictor *this,char *identifier,Pipeline *next,action_e action,uint columns,
          uint samples_per_pixel,uint bits_per_sample)

{
  runtime_error *prVar1;
  code *pcVar2;
  uint uVar3;
  undefined *puVar4;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_TIFFPredictor_002aca10;
  this->action = action;
  this->columns = columns;
  this->samples_per_pixel = samples_per_pixel;
  this->bits_per_sample = bits_per_sample;
  (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (next == (Pipeline *)0x0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              ((logic_error *)prVar1,"Attempt to create Pl_TIFFPredictor with nullptr as next");
    pcVar2 = std::logic_error::~logic_error;
    puVar4 = &std::logic_error::typeinfo;
  }
  else {
    if (samples_per_pixel == 0) {
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar1,"TIFFPredictor created with invalid samples_per_pixel");
    }
    else {
      if (0xffffffbf < bits_per_sample - 0x41) {
        uVar3 = samples_per_pixel * columns * bits_per_sample + 7;
        if (uVar3 < 8) {
          prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar1,"TIFFPredictor created with invalid columns value");
        }
        else {
          uVar3 = uVar3 >> 3;
          if (((anonymous_namespace)::memory_limit == 0) ||
             ((ulong)uVar3 <= (anonymous_namespace)::memory_limit >> 1)) {
            this->bytes_per_row = uVar3;
            return;
          }
          prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar1,"TIFFPredictor memory limit exceeded");
        }
        __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar1,"TIFFPredictor created with invalid bits_per_sample")
      ;
    }
    pcVar2 = std::runtime_error::~runtime_error;
    puVar4 = &std::runtime_error::typeinfo;
  }
  __cxa_throw(prVar1,puVar4,pcVar2);
}

Assistant:

Pl_TIFFPredictor::Pl_TIFFPredictor(
    char const* identifier,
    Pipeline* next,
    action_e action,
    unsigned int columns,
    unsigned int samples_per_pixel,
    unsigned int bits_per_sample) :
    Pipeline(identifier, next),
    action(action),
    columns(columns),
    samples_per_pixel(samples_per_pixel),
    bits_per_sample(bits_per_sample)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_TIFFPredictor with nullptr as next");
    }
    if (samples_per_pixel < 1) {
        throw std::runtime_error("TIFFPredictor created with invalid samples_per_pixel");
    }
    if ((bits_per_sample < 1) || (bits_per_sample > (8 * (sizeof(unsigned long long))))) {
        throw std::runtime_error("TIFFPredictor created with invalid bits_per_sample");
    }
    unsigned long long bpr = ((columns * bits_per_sample * samples_per_pixel) + 7) / 8;
    if ((bpr == 0) || (bpr > (UINT_MAX - 1))) {
        throw std::runtime_error("TIFFPredictor created with invalid columns value");
    }
    if (memory_limit > 0 && bpr > (memory_limit / 2U)) {
        throw std::runtime_error("TIFFPredictor memory limit exceeded");
    }
    this->bytes_per_row = bpr & UINT_MAX;
}